

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cpp
# Opt level: O2

void testing::Mock::Register(void *mock_obj,UntypedFunctionMockerBase *mocker)

{
  mapped_type *pmVar1;
  key_type *in_RSI;
  MutexLock l;
  GTestMutexLock local_20;
  UntypedFunctionMockerBase *local_18;
  
  local_20.mutex_ = (MutexBase *)internal::g_gmock_mutex;
  internal::MutexBase::Lock((MutexBase *)internal::g_gmock_mutex);
  pmVar1 = std::
           map<const_void_*,_testing::(anonymous_namespace)::MockObjectState,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>_>
           ::operator[]((map<const_void_*,_testing::(anonymous_namespace)::MockObjectState,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>_>
                         *)&stack0xfffffffffffffff0,in_RSI);
  std::
  _Rb_tree<testing::internal::UntypedFunctionMockerBase*,testing::internal::UntypedFunctionMockerBase*,std::_Identity<testing::internal::UntypedFunctionMockerBase*>,std::less<testing::internal::UntypedFunctionMockerBase*>,std::allocator<testing::internal::UntypedFunctionMockerBase*>>
  ::_M_insert_unique<testing::internal::UntypedFunctionMockerBase*const&>
            ((_Rb_tree<testing::internal::UntypedFunctionMockerBase*,testing::internal::UntypedFunctionMockerBase*,std::_Identity<testing::internal::UntypedFunctionMockerBase*>,std::less<testing::internal::UntypedFunctionMockerBase*>,std::allocator<testing::internal::UntypedFunctionMockerBase*>>
              *)&pmVar1->function_mockers,&local_18);
  internal::GTestMutexLock::~GTestMutexLock(&local_20);
  return;
}

Assistant:

GTEST_LOCK_EXCLUDED_(internal::g_gmock_mutex) {
  internal::MutexLock l(&internal::g_gmock_mutex);
  g_mock_object_registry.states()[mock_obj].function_mockers.insert(mocker);
}